

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O0

StateNode * __thiscall
QDateTimeParser::scanString(QDateTimeParser *this,QDateTime *defaultValue,bool fixup)

{
  QCalendar cal;
  QCalendar cal_00;
  QLatin1StringView s;
  QDate date_00;
  QDate date_01;
  QDate date_02;
  QDate date_03;
  QDate date_04;
  QCalendar calendar;
  QStringView separator_00;
  QStringView separator_01;
  QStringView text;
  QStringView text_00;
  SectionNode sn_00;
  SectionNode sn_01;
  QStringView name;
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  QFlags<QDateTimeParser::FieldInfoFlag> lhs;
  int iVar6;
  enum_type eVar7;
  enum_type eVar8;
  qsizetype qVar9;
  time_t tVar10;
  const_reference pSVar11;
  State *pSVar12;
  int *piVar13;
  ushort *puVar14;
  qsizetype qVar15;
  enum_type *peVar16;
  SectionNode *pSVar17;
  time_t *ptVar18;
  byte in_CL;
  QDateTime *in_RDX;
  long *in_RSI;
  long *__timer;
  StateNode *in_RDI;
  long in_FS_OFFSET;
  qint64 msecs;
  bool hasHour;
  FormatType dayFormat;
  int dayOfWeek;
  int i;
  bool needfixday;
  Section fieldType;
  SectionNode *sn_1;
  int step;
  bool isUtc;
  bool isUtcOffset;
  int *current;
  int step_1;
  QString *separator;
  int index;
  int pos;
  int padding;
  int sectionNodesCount;
  bool conflicts;
  QTime tick;
  QDateTime replace;
  QDateTime when;
  QTime time;
  QDate date;
  QString dayName;
  SectionNode sn_2;
  QLocale loc;
  QDate date_1;
  QDate date_2;
  QTimeZone namedZone;
  QStringView offsetStr;
  QStringView zoneName;
  QString newText;
  FieldInfo fi;
  ParsedSection sect;
  QDateTime usedDateTime;
  SectionNode sn;
  int zoneOffset;
  Sections isSet;
  int ampm;
  QTimeZone timeZone;
  int dayofweek;
  int msec;
  int second;
  int minute;
  int hour12;
  int hour;
  int year2digits;
  QTime defaultTime;
  QDate defaultDate;
  int day;
  int month;
  int year;
  State state;
  enum_type in_stack_fffffffffffff958;
  QFlagsStorage<QDateTimeParser::Section> in_stack_fffffffffffff95c;
  undefined1 bad;
  enum_type in_stack_fffffffffffff960;
  State in_stack_fffffffffffff964;
  QFlagsStorage<QDateTimeParser::FieldInfoFlag> in_stack_fffffffffffff968;
  int in_stack_fffffffffffff96c;
  StateNode *in_stack_fffffffffffff970;
  StateNode *this_00;
  int in_stack_fffffffffffff978;
  undefined2 in_stack_fffffffffffff97c;
  QChar in_stack_fffffffffffff97e;
  undefined4 in_stack_fffffffffffff980;
  QTime in_stack_fffffffffffff984;
  undefined4 in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff98c;
  undefined4 in_stack_fffffffffffff990;
  int in_stack_fffffffffffff994;
  undefined4 in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff99c;
  undefined8 in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  QDateTime *in_stack_fffffffffffff9b0;
  bool local_631;
  undefined4 in_stack_fffffffffffff9d0;
  int in_stack_fffffffffffff9d4;
  QDateTimeParser *in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  QTimeZone *in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffff9f4;
  long *in_stack_fffffffffffff9f8;
  QByteArray *in_stack_fffffffffffffa00;
  QTimeZone *in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa38;
  int in_stack_fffffffffffffa3c;
  int in_stack_fffffffffffffa40;
  int in_stack_fffffffffffffa44;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  storage_type_conflict *in_stack_fffffffffffffa78;
  bool local_569;
  bool local_526;
  bool local_525;
  undefined8 in_stack_fffffffffffffb38;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  int local_4b0;
  QLatin1StringView in_stack_fffffffffffffb80;
  QCalendar QVar19;
  QFlagsStorage<QDateTimeParser::FieldInfoFlag> in_stack_fffffffffffffb94;
  enum_type *local_460;
  int local_458;
  int in_stack_fffffffffffffbb0;
  QStringView in_stack_fffffffffffffbb8;
  int local_424;
  int local_420;
  undefined1 local_3f8 [52];
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_3c4;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_3c0;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_3bc;
  qint64 local_3b8;
  undefined4 local_3ac;
  Data local_3a8;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_39c;
  qint64 local_398;
  undefined4 local_390;
  int local_38c;
  time_t *local_388;
  Data local_380;
  int local_374;
  long local_370;
  time_t *local_368;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_360;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined1 *local_348;
  undefined1 *puStack_340;
  undefined1 *local_338;
  long local_328;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_314;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_2dc;
  undefined1 *local_2d8;
  undefined1 *puStack_2d0;
  undefined1 *local_2c0;
  int local_2b4;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_2b0;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_2ac;
  long local_2a8;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_2a0;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_29c;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_298;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_294;
  undefined1 *local_290;
  long local_288;
  undefined1 *local_280;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_274;
  long local_270;
  Int local_264;
  undefined1 *local_260;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_254;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_22c;
  QString local_228;
  QMessageLogger local_210;
  int local_1ec [9];
  undefined1 *local_1c8;
  undefined1 local_1c0 [8];
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  QLatin1StringView local_1a0;
  QLatin1StringView local_190;
  QChar local_17c;
  QChar local_17a;
  QStringView local_178;
  QStringView local_158;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined1 *local_138;
  QFlagsStorageHelper<QDateTimeParser::FieldInfoFlag,_4> local_12c;
  undefined1 local_128 [12];
  State aSStack_11c [3];
  QFlagsStorage<QDateTimeParser::Section> *local_110;
  enum_type *local_100;
  enum_type *local_f8;
  enum_type *local_f0;
  enum_type *local_e8;
  enum_type *local_e0;
  enum_type *local_d8;
  enum_type *local_d0;
  enum_type *local_c8;
  enum_type *local_c0;
  enum_type *local_b8;
  enum_type *local_b0;
  undefined1 **local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  enum_type local_7c [9];
  QFlagsStorage<QDateTimeParser::Section> local_58;
  enum_type local_54;
  undefined1 *local_50;
  qint64 local_48;
  enum_type local_40;
  enum_type local_3c;
  enum_type local_38;
  enum_type local_34;
  enum_type local_30;
  enum_type local_2c;
  enum_type local_28;
  undefined4 local_24;
  undefined1 *local_20;
  enum_type local_18 [3];
  State local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = Acceptable;
  bVar4 = false;
  __timer = in_RSI;
  qVar9 = QList<QDateTimeParser::SectionNode>::size
                    ((QList<QDateTimeParser::SectionNode> *)(in_RSI + 6));
  local_420 = 0;
  local_18[2] = -0x55555556;
  local_18[1] = 0xaaaaaaaa;
  local_18[0] = 0xaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = (undefined1 *)
             QDateTime::date((QDateTime *)
                             CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i));
  local_24 = 0xaaaaaaaa;
  tVar10 = QDateTime::time(in_RDX,__timer);
  local_24 = (undefined4)tVar10;
  QDate::getDate((QDate *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                 (int *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                 (int *)CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980),
                 (int *)CONCAT26(in_stack_fffffffffffff97e.ucs,
                                 CONCAT24(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)));
  local_28 = (int)local_18[2] % 100;
  local_2c = QTime::hour((QTime *)CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958));
  local_30 = 0xffffffff;
  local_34 = QTime::minute((QTime *)CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958))
  ;
  local_38 = QTime::second((QTime *)CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958))
  ;
  local_3c = QTime::msec((QTime *)CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958));
  local_48 = (qint64)local_20;
  date_00.jd._4_4_ = in_stack_fffffffffffff98c;
  date_00.jd._0_4_ = in_stack_fffffffffffff988;
  local_40 = QCalendar::dayOfWeek
                       ((QCalendar *)
                        CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980),date_00);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDateTime::timeRepresentation
            ((QDateTime *)CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958));
  local_54 = 0xffffffff;
  local_58.i = 0xaaaaaaaa;
  QFlags<QDateTimeParser::Section>::QFlags
            ((QFlags<QDateTimeParser::Section> *)
             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
             in_stack_fffffffffffff95c.i);
  local_424 = 0;
  while( true ) {
    iVar5 = (int)in_stack_fffffffffffffbb8.m_size;
    QVar19.d_ptr = (QCalendarBackend *)in_stack_fffffffffffffb80.m_data;
    if ((int)qVar9 <= local_424) break;
    QList<QString>::at((QList<QString> *)
                       CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                       CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958));
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_fffffffffffff970,
               (QString *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i));
    in_stack_fffffffffffffbb8 =
         QStringView::sliced((QStringView *)
                             CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980),
                             CONCAT26(in_stack_fffffffffffff97e.ucs,
                                      CONCAT24(in_stack_fffffffffffff97c,in_stack_fffffffffffff978))
                            );
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_fffffffffffff970,
               (QString *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i));
    text.m_size._4_4_ = in_stack_fffffffffffff9e4;
    text.m_size._0_4_ = in_stack_fffffffffffff9e0;
    text.m_data = (storage_type_conflict *)in_stack_fffffffffffff9e8;
    separator_00.m_size._4_4_ = in_stack_fffffffffffff9d4;
    separator_00.m_size._0_4_ = in_stack_fffffffffffff9d0;
    separator_00.m_data = (storage_type_conflict *)in_stack_fffffffffffff9d8;
    iVar5 = matchesSeparator(text,separator_00);
    if (iVar5 == -1) {
      StateNode::StateNode
                ((StateNode *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
      goto LAB_007715ba;
    }
    local_420 = local_420 + iVar5;
    pSVar11 = QList<QDateTimeParser::SectionNode>::operator[]
                        ((QList<QDateTimeParser::SectionNode> *)
                         CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                         CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958));
    pSVar11->pos = local_420;
    local_7c[0] = 0xaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    pSVar11 = QList<QDateTimeParser::SectionNode>::at
                        ((QList<QDateTimeParser::SectionNode> *)
                         CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                         CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958));
    local_98._0_4_ = pSVar11->type;
    local_98._4_4_ = pSVar11->pos;
    puStack_90._0_4_ = pSVar11->count;
    puStack_90._4_4_ = pSVar11->zeroesAdded;
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_110 = &local_58;
    local_100 = local_18 + 2;
    local_f8 = &local_28;
    local_f0 = local_18 + 1;
    local_e8 = local_18;
    local_e0 = &local_40;
    local_d8 = &local_2c;
    local_d0 = &local_30;
    local_c8 = &local_54;
    local_c0 = &local_34;
    local_b8 = &local_38;
    local_b0 = &local_3c;
    local_a8 = &local_50;
    scanString::anon_class_112_14_21ae3d21::operator()
              ((anon_class_112_14_21ae3d21 *)
               CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980));
    local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xfffffffffffffee0 = &DAT_aaaaaaaaaaaaaaaa;
    _local_128 = parseSection((QDateTimeParser *)
                              CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                              (QDateTime *)
                              CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                              (int)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                              (int)in_stack_fffffffffffffb38);
    if (((in_CL & 1) != 0) && (aSStack_11c[0] == Intermediate)) {
      if ((int)local_128._4_4_ < (int)puStack_90) {
        local_12c.super_QFlagsStorage<QDateTimeParser::FieldInfoFlag>.i =
             (QFlagsStorage<QDateTimeParser::FieldInfoFlag>)0xaaaaaaaa;
        local_12c.super_QFlagsStorage<QDateTimeParser::FieldInfoFlag>.i =
             (QFlagsStorage<QDateTimeParser::FieldInfoFlag>)
             fieldInfo(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d4);
        ::operator|(in_stack_fffffffffffff964,in_stack_fffffffffffff960);
        lhs = QFlags<QDateTimeParser::FieldInfoFlag>::operator&
                        ((QFlags<QDateTimeParser::FieldInfoFlag> *)
                         CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                         (QFlags<QDateTimeParser::FieldInfoFlag>)in_stack_fffffffffffff968.i);
        in_stack_fffffffffffffb94.i =
             (Int)::operator|(in_stack_fffffffffffff964,in_stack_fffffffffffff960);
        bVar2 = ::operator==(lhs,(QFlags<QDateTimeParser::FieldInfoFlag>)in_stack_fffffffffffffb94.i
                            );
        if (bVar2) {
          local_148 = 0xaaaaaaaa;
          uStack_144 = 0xaaaaaaaa;
          uStack_140 = 0xaaaaaaaa;
          uStack_13c = 0xaaaaaaaa;
          local_138 = &DAT_aaaaaaaaaaaaaaaa;
          QString::asprintf((char **)&local_148,"%0*d",(ulong)puStack_90 & 0xffffffff,
                            local_128._0_8_ & 0xffffffff);
          QString::replace((QString *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                           CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                           CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980),
                           (QString *)
                           CONCAT26(in_stack_fffffffffffff97e.ucs,
                                    CONCAT24(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)));
          local_128._4_4_ = (int)puStack_90;
          QString::~QString((QString *)0x76f7a5);
        }
      }
    }
    pSVar12 = qMin<QDateTimeParser::State>(&local_c,(State *)(local_128 + 0xc));
    local_c = *pSVar12;
    if ((local_c == Invalid) ||
       (((int)in_RSI[0x11] == 0 && ((local_c == Intermediate || (local_128._8_4_ != 0)))))) {
      StateNode::StateNode
                ((StateNode *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
      local_458 = 1;
    }
    else {
      if ((Section)local_98 == 1) {
        local_460 = &local_54;
      }
      else if ((Section)local_98 == 2) {
        local_460 = &local_3c;
      }
      else if ((Section)local_98 == 4) {
        local_460 = &local_38;
      }
      else if ((Section)local_98 == 8) {
        local_460 = &local_34;
      }
      else if ((Section)local_98 == 0x10) {
        local_460 = &local_30;
      }
      else if ((Section)local_98 == 0x20) {
        local_460 = &local_2c;
      }
      else if ((Section)local_98 == 0x40) {
        local_460 = local_7c;
        if (0 < (int)local_128._4_4_) {
          local_158.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
          local_158.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          QStringView::QStringView<QString,_true>
                    ((QStringView *)in_stack_fffffffffffff970,
                     (QString *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i));
          local_158 = QStringView::sliced((QStringView *)
                                          CONCAT44(in_stack_fffffffffffff984.mds,
                                                   in_stack_fffffffffffff980),
                                          CONCAT26(in_stack_fffffffffffff97e.ucs,
                                                   CONCAT24(in_stack_fffffffffffff97c,
                                                            in_stack_fffffffffffff978)),
                                          (qsizetype)in_stack_fffffffffffff970);
          local_178.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_178.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
          in_stack_fffffffffffffb80 =
               Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i),
                          CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          s.m_size._4_4_ = in_stack_fffffffffffff984.mds;
          s.m_size._0_4_ = in_stack_fffffffffffff980;
          s.m_data._0_4_ = in_stack_fffffffffffff988;
          s.m_data._4_4_ = in_stack_fffffffffffff98c;
          bVar2 = QStringView::startsWith
                            ((QStringView *)
                             CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958),s,
                             CaseInsensitive);
          if (bVar2) {
            local_178 = QStringView::sliced((QStringView *)
                                            CONCAT44(in_stack_fffffffffffff984.mds,
                                                     in_stack_fffffffffffff980),
                                            CONCAT26(in_stack_fffffffffffff97e.ucs,
                                                     CONCAT24(in_stack_fffffffffffff97c,
                                                              in_stack_fffffffffffff978)));
          }
          else {
            local_178 = local_158;
          }
          QChar::QChar<char16_t,_true>(&local_17a,L'+');
          bVar2 = QStringView::startsWith
                            ((QStringView *)in_stack_fffffffffffff970,in_stack_fffffffffffff97e);
          local_525 = true;
          if (!bVar2) {
            QChar::QChar<char16_t,_true>(&local_17c,L'-');
            local_525 = QStringView::startsWith
                                  ((QStringView *)in_stack_fffffffffffff970,
                                   in_stack_fffffffffffff97e);
          }
          local_190 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT44(in_stack_fffffffffffff96c,
                                                  in_stack_fffffffffffff968.i),
                                 CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          bVar2 = ::operator==((QStringView *)
                               CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958));
          local_526 = true;
          if (!bVar2) {
            local_1a0 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)CONCAT44(in_stack_fffffffffffff96c,
                                                    in_stack_fffffffffffff968.i),
                                   CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
            local_526 = ::operator==((QStringView *)
                                     CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958)
                                    );
          }
          if ((local_526 == false) && (local_525 == false)) {
            local_1b8 = (undefined4)local_158.m_size;
            uStack_1b4 = local_158.m_size._4_4_;
            uStack_1b0 = local_158.m_data._0_4_;
            uStack_1ac = local_158.m_data._4_4_;
            (**(code **)(*in_RSI + 0x30))(local_1c0);
            name.m_size._4_4_ = in_stack_fffffffffffffa74;
            name.m_size._0_4_ = in_stack_fffffffffffffa70;
            name.m_data = in_stack_fffffffffffffa78;
            iVar5 = startsWithLocalTimeZone
                              (name,in_stack_fffffffffffff9b0,
                               (QLocale *)
                               CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            uVar1 = local_128._4_4_;
            QLocale::~QLocale((QLocale *)0x76fc64);
            if (iVar5 == uVar1) {
              QTimeZone::QTimeZone
                        ((QTimeZone *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                         in_stack_fffffffffffff95c.i);
              QTimeZone::operator=
                        ((QTimeZone *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                         (QTimeZone *)
                         CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958));
              QTimeZone::~QTimeZone((QTimeZone *)0x76fd9f);
            }
            else {
              local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
              QStringView::toLatin1
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
              QTimeZone::QTimeZone(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
              QByteArray::~QByteArray((QByteArray *)0x76fcc7);
              QTimeZone::operator=
                        ((QTimeZone *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                         (QTimeZone *)
                         CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958));
              QTimeZone::~QTimeZone((QTimeZone *)0x76fceb);
            }
          }
          else {
            QTimeZone::fromSecondsAheadOfUtc
                      (CONCAT22(in_stack_fffffffffffff97e.ucs,in_stack_fffffffffffff97c));
            QTimeZone::operator=
                      ((QTimeZone *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                       (QTimeZone *)CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958))
            ;
            QTimeZone::~QTimeZone((QTimeZone *)0x76fbeb);
          }
        }
      }
      else if ((Section)local_98 == 0x100) {
        local_460 = local_18;
        local_1ec[0] = 1;
        piVar13 = qMax<int>(local_1ec,(int *)local_128);
        local_128._0_4_ = *piVar13;
      }
      else if ((Section)local_98 == 0x200) {
        local_460 = local_18 + 1;
      }
      else if ((Section)local_98 == 0x400) {
        local_460 = local_18 + 2;
      }
      else if ((Section)local_98 == 0x800) {
        local_460 = &local_28;
      }
      else {
        if (((Section)local_98 != 0x1000) && ((Section)local_98 != 0x2000)) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffff970,
                     (char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i),
                     in_stack_fffffffffffff964,
                     (char *)CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958));
          SectionNode::name((SectionNode *)
                            CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958));
          QtPrivate::asString(&local_228);
          puVar14 = QString::utf16((QString *)
                                   CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          QMessageLogger::warning(&local_210,"QDateTimeParser::parse Internal error (%ls)",puVar14);
          QString::~QString((QString *)0x76ff52);
          StateNode::StateNode
                    ((StateNode *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
          local_458 = 1;
          goto LAB_00770077;
        }
        local_460 = &local_40;
      }
      if (0 < (int)local_128._4_4_) {
        local_420 = local_128._4_4_ + local_420;
      }
      local_22c.super_QFlagsStorage<QDateTimeParser::Section>.i =
           (QFlagsStorage<QDateTimeParser::Section>)
           QFlags<QDateTimeParser::Section>::operator&
                     ((QFlags<QDateTimeParser::Section> *)
                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                      in_stack_fffffffffffff95c.i);
      bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_22c);
      bVar2 = false;
      if (bVar3) {
        bVar2 = *local_460 != local_128._0_4_;
      }
      if ((bVar2) && (bVar4 = true, local_424 != (int)in_RSI[1])) {
        local_458 = 4;
      }
      else {
        *local_460 = local_128._0_4_;
        QFlags<QDateTimeParser::Section>::operator|=
                  ((QFlags<QDateTimeParser::Section> *)&local_58,(Section)local_98);
        local_458 = 0;
      }
    }
LAB_00770077:
    QDateTime::~QDateTime((QDateTime *)0x770084);
    if ((local_458 != 0) && (local_458 != 4)) goto LAB_007715ba;
    local_424 = local_424 + 1;
  }
  QStringView::QStringView<QString,_true>
            ((QStringView *)in_stack_fffffffffffff970,
             (QString *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i));
  QStringView::sliced((QStringView *)
                      CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980),
                      CONCAT26(in_stack_fffffffffffff97e.ucs,
                               CONCAT24(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)));
  QList<QString>::last
            ((QList<QString> *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i));
  QStringView::QStringView<QString,_true>
            ((QStringView *)in_stack_fffffffffffff970,
             (QString *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i));
  text_00.m_size._4_4_ = in_stack_fffffffffffff9e4;
  text_00.m_size._0_4_ = in_stack_fffffffffffff9e0;
  text_00.m_data = (storage_type_conflict *)in_stack_fffffffffffff9e8;
  separator_01.m_size._4_4_ = in_stack_fffffffffffff9d4;
  separator_01.m_size._0_4_ = in_stack_fffffffffffff9d0;
  separator_01.m_data = (storage_type_conflict *)in_stack_fffffffffffff9d8;
  iVar6 = matchesSeparator(text_00,separator_01);
  if (iVar6 != -1) {
    qVar15 = QString::size((QString *)(in_RSI + 3));
    if (qVar15 <= iVar6 + local_420) {
      if ((int)in_RSI[0x10] != 0xf) {
        local_569 = false;
        if ((int)local_18[2] % 100 != local_28) {
          local_254.super_QFlagsStorage<QDateTimeParser::Section>.i =
               (QFlagsStorage<QDateTimeParser::Section>)
               QFlags<QDateTimeParser::Section>::operator&
                         ((QFlags<QDateTimeParser::Section> *)
                          CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                          in_stack_fffffffffffff95c.i);
          local_569 = ::QFlags::operator_cast_to_bool((QFlags *)&local_254);
        }
        if (local_569 != false) {
          local_260 = &DAT_aaaaaaaaaaaaaaaa;
          local_264 = local_58.i;
          local_270 = in_RSI[0x12];
          in_stack_fffffffffffff958 = local_18[0];
          in_stack_fffffffffffff960 = local_40;
          local_260 = (undefined1 *)
                      actualDate((Sections)in_stack_fffffffffffffb94.i,QVar19,
                                 in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
                                 in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38,
                                 in_stack_fffffffffffffbb0,iVar5);
          bVar2 = QDate::isValid((QDate *)in_stack_fffffffffffff970);
          if (bVar2) {
            local_274.super_QFlagsStorage<QDateTimeParser::Section>.i =
                 (QFlagsStorage<QDateTimeParser::Section>)
                 QFlags<QDateTimeParser::Section>::operator&
                           ((QFlags<QDateTimeParser::Section> *)
                            CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                            in_stack_fffffffffffff95c.i);
            bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_274);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              bVar4 = true;
              pSVar17 = sectionNode((QDateTimeParser *)
                                    CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980
                                            ),
                                    CONCAT22(in_stack_fffffffffffff97e.ucs,in_stack_fffffffffffff97c
                                            ));
              if (pSVar17->type == YearSection2Digits) {
                local_18[2] = QDate::year((QDate *)CONCAT44(in_stack_fffffffffffff964,
                                                            in_stack_fffffffffffff960));
              }
            }
            else {
              local_18[2] = QDate::year((QDate *)CONCAT44(in_stack_fffffffffffff964,
                                                          in_stack_fffffffffffff960));
            }
          }
          else {
            local_c = Invalid;
          }
        }
        sectionType((QDateTimeParser *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960)
                    ,in_stack_fffffffffffff95c.i);
        local_280 = &DAT_aaaaaaaaaaaaaaaa;
        local_288 = in_RSI[0x12];
        QVar19.d_ptr._4_2_ = in_stack_fffffffffffff97c;
        QVar19.d_ptr._0_4_ = in_stack_fffffffffffff978;
        QVar19.d_ptr._6_2_ = in_stack_fffffffffffff97e.ucs;
        QDate::QDate((QDate *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i),
                     in_stack_fffffffffffff964,in_stack_fffffffffffff960,in_stack_fffffffffffff95c.i
                     ,QVar19);
        bVar2 = QDate::isValid((QDate *)in_stack_fffffffffffff970);
        if (bVar2) {
          local_290 = local_280;
          date_01.jd._4_4_ = in_stack_fffffffffffff98c;
          date_01.jd._0_4_ = in_stack_fffffffffffff988;
          eVar8 = local_40;
          eVar7 = QCalendar::dayOfWeek
                            ((QCalendar *)
                             CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980),
                             date_01);
          bVar2 = false;
          if (eVar8 != eVar7) goto LAB_007704e6;
        }
        else {
LAB_007704e6:
          bVar2 = false;
          if (local_c == Acceptable) {
            local_294.super_QFlagsStorage<QDateTimeParser::Section>.i =
                 (QFlagsStorage<QDateTimeParser::Section>)
                 QFlags<QDateTimeParser::Section>::operator&
                           ((QFlags<QDateTimeParser::Section> *)
                            CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                            in_stack_fffffffffffff95c.i);
            bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_294);
          }
        }
        if (bVar2 != false) {
          local_298.super_QFlagsStorage<QDateTimeParser::Section>.i =
               (QFlagsStorage<QDateTimeParser::Section>)
               QFlags<QDateTimeParser::Section>::operator&
                         ((QFlags<QDateTimeParser::Section> *)
                          CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                          in_stack_fffffffffffff95c.i);
          bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_298);
          if (bVar2) {
            bVar4 = true;
          }
          bVar2 = true;
          if ((int)in_RSI[1] != -1) {
            local_29c.super_QFlagsStorage<QDateTimeParser::Section>.i =
                 (QFlagsStorage<QDateTimeParser::Section>)
                 ::operator&(in_stack_fffffffffffff964,in_stack_fffffffffffff960);
            bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_29c);
            bVar2 = true;
            if ((!bVar3) && (bVar2 = false, !bVar4)) {
              ::operator|(in_stack_fffffffffffff964,in_stack_fffffffffffff960);
              local_2a0.super_QFlagsStorage<QDateTimeParser::Section>.i =
                   (QFlagsStorage<QDateTimeParser::Section>)
                   ::operator&(NoSection,
                               (QFlags<QDateTimeParser::Section>)in_stack_fffffffffffff95c.i);
              bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_2a0);
            }
          }
          if (bVar2 != false) {
            local_2a8 = in_RSI[0x12];
            calendar.d_ptr._4_4_ = in_stack_fffffffffffff99c;
            calendar.d_ptr._0_4_ = in_stack_fffffffffffff998;
            local_18[0] = weekDayWithinMonth(calendar,(int)((ulong)in_stack_fffffffffffff970 >> 0x20
                                                           ),(int)in_stack_fffffffffffff970,
                                             in_stack_fffffffffffff994,in_stack_fffffffffffff96c);
          }
        }
        bVar4 = false;
        local_2ac.super_QFlagsStorage<QDateTimeParser::Section>.i =
             (QFlagsStorage<QDateTimeParser::Section>)
             ::operator&(in_stack_fffffffffffff964,in_stack_fffffffffffff960);
        bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_2ac);
        if (bVar2) {
          *(enum_type *)((long)in_RSI + 0x14) = local_18[0];
        }
        else {
          bVar4 = false;
          if ((int)local_18[0] < *(int *)((long)in_RSI + 0x14)) {
            local_2b0.super_QFlagsStorage<QDateTimeParser::Section>.i =
                 (QFlagsStorage<QDateTimeParser::Section>)
                 QFlags<QDateTimeParser::Section>::operator&
                           ((QFlags<QDateTimeParser::Section> *)
                            CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                            in_stack_fffffffffffff95c.i);
            bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_2b0);
            bVar4 = !bVar4 || local_c != Acceptable;
          }
          if (bVar4) {
            local_18[0] = *(enum_type *)((long)in_RSI + 0x14);
          }
        }
        bVar2 = QCalendar::isDateValid
                          ((QCalendar *)
                           CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980),
                           CONCAT22(in_stack_fffffffffffff97e.ucs,in_stack_fffffffffffff97c),
                           in_stack_fffffffffffff978,(int)((ulong)in_stack_fffffffffffff970 >> 0x20)
                          );
        eVar8 = local_18[0];
        if (!bVar2) {
          iVar5 = QCalendar::maximumDaysInMonth((QCalendar *)in_stack_fffffffffffff970);
          if ((int)eVar8 <= iVar5) {
            *(enum_type *)((long)in_RSI + 0x14) = local_18[0];
          }
          eVar8 = local_18[0];
          iVar5 = QCalendar::minimumDaysInMonth((QCalendar *)in_stack_fffffffffffff970);
          if (iVar5 < (int)eVar8) {
            bVar2 = QCalendar::isDateValid
                              ((QCalendar *)
                               CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980),
                               CONCAT22(in_stack_fffffffffffff97e.ucs,in_stack_fffffffffffff97c),
                               in_stack_fffffffffffff978,
                               (int)((ulong)in_stack_fffffffffffff970 >> 0x20));
            if (bVar2) {
              bVar4 = true;
            }
          }
        }
        if (bVar4) {
          if ((int)in_RSI[0x11] == 0) {
            StateNode::StateNode
                      ((StateNode *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
            goto LAB_007715ba;
          }
          if ((local_c == Acceptable) && ((*(byte *)((long)in_RSI + 0x84) & 1) != 0)) {
            local_2b4 = QCalendar::daysInMonth
                                  ((QCalendar *)
                                   CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980)
                                   ,CONCAT22(in_stack_fffffffffffff97e.ucs,in_stack_fffffffffffff97c
                                            ),in_stack_fffffffffffff978);
            peVar16 = (enum_type *)qMin<int>((int *)local_18,&local_2b4);
            local_18[0] = *peVar16;
            local_2c0 = &DAT_aaaaaaaaaaaaaaaa;
            (**(code **)(*in_RSI + 0x30))(&local_2c0);
            for (local_4b0 = 0; local_4b0 < (int)qVar9; local_4b0 = local_4b0 + 1) {
              local_2d8 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_2d0 = &DAT_aaaaaaaaaaaaaaaa;
              pSVar17 = sectionNode((QDateTimeParser *)
                                    CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980
                                            ),
                                    CONCAT22(in_stack_fffffffffffff97e.ucs,in_stack_fffffffffffff97c
                                            ));
              local_2d8._0_4_ = pSVar17->type;
              local_2d8._4_4_ = pSVar17->pos;
              puStack_2d0._0_4_ = pSVar17->count;
              puStack_2d0._4_4_ = pSVar17->zeroesAdded;
              local_2dc.super_QFlagsStorage<QDateTimeParser::Section>.i =
                   (QFlagsStorage<QDateTimeParser::Section>)
                   ::operator&(in_stack_fffffffffffff964,in_stack_fffffffffffff960);
              bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_2dc);
              if (bVar4) {
                local_2f8 = local_2d8;
                uStack_2f0 = puStack_2d0;
                sn_00.pos = in_stack_fffffffffffff9f4;
                sn_00.type = in_stack_fffffffffffff9f0;
                sn_00._8_8_ = in_stack_fffffffffffff9f8;
                sectionPos((QDateTimeParser *)
                           CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),sn_00);
                sectionSize((QDateTimeParser *)
                            CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                            (int)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
                QLocale::toString((QLocale *)
                                  CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i),
                                  in_stack_fffffffffffff964);
                QString::replace((QString *)
                                 CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                                 CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                                 CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980),
                                 (QString *)
                                 CONCAT26(in_stack_fffffffffffff97e.ucs,
                                          CONCAT24(in_stack_fffffffffffff97c,
                                                   in_stack_fffffffffffff978)));
                QString::~QString((QString *)0x770afa);
              }
              else {
                local_314.super_QFlagsStorage<QDateTimeParser::Section>.i =
                     (QFlagsStorage<QDateTimeParser::Section>)
                     ::operator&(in_stack_fffffffffffff964,in_stack_fffffffffffff960);
                bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_314);
                if (bVar4) {
                  in_stack_fffffffffffff9f8 = in_RSI + 0x12;
                  local_328 = in_RSI[0x12];
                  cal.d_ptr._4_2_ = in_stack_fffffffffffff97c;
                  cal.d_ptr._0_4_ = in_stack_fffffffffffff978;
                  cal.d_ptr._6_2_ = in_stack_fffffffffffff97e.ucs;
                  QDate::QDate((QDate *)CONCAT44(in_stack_fffffffffffff96c,
                                                 in_stack_fffffffffffff968.i),
                               in_stack_fffffffffffff964,in_stack_fffffffffffff960,
                               in_stack_fffffffffffff95c.i,cal);
                  date_02.jd._4_4_ = in_stack_fffffffffffff98c;
                  date_02.jd._0_4_ = in_stack_fffffffffffff988;
                  in_stack_fffffffffffff9f4 =
                       QCalendar::dayOfWeek
                                 ((QCalendar *)
                                  CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980),
                                  date_02);
                  local_338 = &DAT_aaaaaaaaaaaaaaaa;
                  local_348 = &DAT_aaaaaaaaaaaaaaaa;
                  puStack_340 = &DAT_aaaaaaaaaaaaaaaa;
                  QLocale::dayName((QLocale *)
                                   CONCAT26(in_stack_fffffffffffff97e.ucs,
                                            CONCAT24(in_stack_fffffffffffff97c,
                                                     in_stack_fffffffffffff978)),
                                   (int)((ulong)in_stack_fffffffffffff970 >> 0x20),
                                   (FormatType)in_stack_fffffffffffff970);
                  in_stack_fffffffffffff9e8 = (QTimeZone *)(in_RSI + 3);
                  local_358 = local_2d8;
                  uStack_350 = puStack_2d0;
                  sn_01.pos = in_stack_fffffffffffff9f4;
                  sn_01.type = in_stack_fffffffffffff9f0;
                  sn_01._8_8_ = in_stack_fffffffffffff9f8;
                  in_stack_fffffffffffff9f0 =
                       sectionPos((QDateTimeParser *)
                                  CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                                  sn_01);
                  sectionSize((QDateTimeParser *)
                              CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                              (int)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
                  QString::replace((QString *)
                                   CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                                   CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                                   CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980)
                                   ,(QString *)
                                    CONCAT26(in_stack_fffffffffffff97e.ucs,
                                             CONCAT24(in_stack_fffffffffffff97c,
                                                      in_stack_fffffffffffff978)));
                  QString::~QString((QString *)0x770cfd);
                }
              }
            }
            QLocale::~QLocale((QLocale *)0x770d4d);
          }
          else if (1 < (int)local_c) {
            local_c = Intermediate;
          }
        }
      }
      eVar8 = local_2c;
      if ((int)in_RSI[0x10] != 0xe) {
        local_35c.super_QFlagsStorage<QDateTimeParser::Section>.i =
             (QFlagsStorage<QDateTimeParser::Section>)
             QFlags<QDateTimeParser::Section>::operator&
                       ((QFlags<QDateTimeParser::Section> *)
                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                        in_stack_fffffffffffff95c.i);
        bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_35c);
        if (bVar4) {
          bVar4 = QFlags<QDateTimeParser::Section>::testAnyFlag
                            ((QFlags<QDateTimeParser::Section> *)
                             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                             in_stack_fffffffffffff95c.i);
          if (local_54 == 0xffffffff) {
            local_54 = (enum_type)(bVar4 && 0xb < (int)local_2c);
          }
          local_30 = (int)local_30 % 0xc + local_54 * 0xc;
          eVar8 = local_30;
          if (bVar4) {
            eVar8 = local_2c;
          }
        }
        else {
          eVar8 = local_2c;
          if (local_54 != 0xffffffff) {
            local_360.super_QFlagsStorage<QDateTimeParser::Section>.i =
                 (QFlagsStorage<QDateTimeParser::Section>)
                 QFlags<QDateTimeParser::Section>::operator&
                           ((QFlags<QDateTimeParser::Section> *)
                            CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                            in_stack_fffffffffffff95c.i);
            bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_360);
            eVar8 = local_2c;
            if (((bVar4 ^ 0xffU) & 1) != 0) {
              eVar8 = local_54 * 0xc;
            }
          }
        }
      }
      local_2c = eVar8;
      local_368 = (time_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_370 = in_RSI[0x12];
      cal_00.d_ptr._4_2_ = in_stack_fffffffffffff97c;
      cal_00.d_ptr._0_4_ = in_stack_fffffffffffff978;
      cal_00.d_ptr._6_2_ = in_stack_fffffffffffff97e.ucs;
      QDate::QDate((QDate *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i),
                   in_stack_fffffffffffff964,in_stack_fffffffffffff960,in_stack_fffffffffffff95c.i,
                   cal_00);
      local_374 = -0x55555556;
      QTime::QTime((QTime *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                   in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958,0,0x770f7a);
      local_380.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_388 = local_368;
      local_38c = local_374;
      date_03.jd._4_4_ = in_stack_fffffffffffff98c;
      date_03.jd._0_4_ = in_stack_fffffffffffff988;
      ptVar18 = local_368;
      QDateTime::QDateTime
                ((QDateTime *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i),
                 date_03,in_stack_fffffffffffff984,
                 (QTimeZone *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                 in_stack_fffffffffffff95c.i);
      tVar10 = QDateTime::time((QDateTime *)&local_380.data,ptVar18);
      local_390 = (undefined4)tVar10;
      bVar4 = ::operator!=((QTime *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                           (QTime *)CONCAT44(in_stack_fffffffffffff95c.i,in_stack_fffffffffffff958))
      ;
      local_631 = true;
      if (!bVar4) {
        local_398 = (qint64)QDateTime::date((QDateTime *)
                                            CONCAT44(in_stack_fffffffffffff96c,
                                                     in_stack_fffffffffffff968.i));
        local_631 = ::operator!=((QDate *)CONCAT44(in_stack_fffffffffffff964,
                                                   in_stack_fffffffffffff960),
                                 (QDate *)CONCAT44(in_stack_fffffffffffff95c.i,
                                                   in_stack_fffffffffffff958));
      }
      if (local_631 == false) {
LAB_0077155f:
        StateNode::StateNode
                  (in_stack_fffffffffffff970,
                   (QDateTime *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i),
                   in_stack_fffffffffffff964,in_stack_fffffffffffff960,
                   SUB41(in_stack_fffffffffffff95c.i >> 0x18,0));
      }
      else {
        local_39c.super_QFlagsStorage<QDateTimeParser::Section>.i =
             (QFlagsStorage<QDateTimeParser::Section>)
             QFlags<QDateTimeParser::Section>::operator&
                       ((QFlags<QDateTimeParser::Section> *)
                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                        in_stack_fffffffffffff95c.i);
        bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_39c);
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          if (1 < (int)local_c) {
            local_c = Intermediate;
          }
          goto LAB_0077155f;
        }
        iVar5 = (int)in_RSI[0x10];
        if (iVar5 == 0xe) {
          QTimeZone::QTimeZone
                    ((QTimeZone *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                     in_stack_fffffffffffff95c.i);
          bad = (undefined1)(in_stack_fffffffffffff95c.i >> 0x18);
          QDate::startOfDay((QDate *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                            in_stack_fffffffffffff9e8);
          StateNode::StateNode
                    (in_stack_fffffffffffff970,
                     (QDateTime *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i),
                     in_stack_fffffffffffff964,in_stack_fffffffffffff960,(bool)bad);
          QDateTime::~QDateTime((QDateTime *)0x7713c7);
          QTimeZone::~QTimeZone((QTimeZone *)0x7713d4);
        }
        else if (iVar5 == 0xf) {
          local_3f8._16_8_ = local_368;
          local_3f8._12_4_ = local_374;
          this_00 = (StateNode *)local_3f8;
          QTimeZone::QTimeZone
                    ((QTimeZone *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                     in_stack_fffffffffffff95c.i);
          date_04.jd._4_4_ = in_stack_fffffffffffff98c;
          date_04.jd._0_4_ = in_stack_fffffffffffff988;
          QDateTime::QDateTime
                    ((QDateTime *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i),
                     date_04,in_stack_fffffffffffff984,
                     (QTimeZone *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                     in_stack_fffffffffffff95c.i);
          StateNode::StateNode
                    (this_00,(QDateTime *)
                             CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i),
                     in_stack_fffffffffffff964,in_stack_fffffffffffff960,
                     SUB41(in_stack_fffffffffffff95c.i >> 0x18,0));
          QDateTime::~QDateTime((QDateTime *)0x7714d5);
          QTimeZone::~QTimeZone((QTimeZone *)0x7714e2);
        }
        else {
          if (iVar5 != 0x10) goto LAB_0077155f;
          ptVar18 = (time_t *)
                    QDateTime::toMSecsSinceEpoch
                              ((QDateTime *)
                               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
          local_3a8.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
          QDateTime::fromMSecsSinceEpoch
                    (CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                     (QTimeZone *)CONCAT44(in_stack_fffffffffffff984.mds,in_stack_fffffffffffff980))
          ;
          local_3ac = 0xaaaaaaaa;
          tVar10 = QDateTime::time((QDateTime *)&local_3a8.data,ptVar18);
          local_3ac = (undefined4)tVar10;
          local_3b8 = (qint64)QDateTime::date((QDateTime *)
                                              CONCAT44(in_stack_fffffffffffff96c,
                                                       in_stack_fffffffffffff968.i));
          bVar2 = ::operator==((QDate *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960
                                                ),
                               (QDate *)CONCAT44(in_stack_fffffffffffff95c.i,
                                                 in_stack_fffffffffffff958));
          bVar4 = false;
          if (bVar2) {
            local_3bc.super_QFlagsStorage<QDateTimeParser::Section>.i =
                 (QFlagsStorage<QDateTimeParser::Section>)
                 QFlags<QDateTimeParser::Section>::operator&
                           ((QFlags<QDateTimeParser::Section> *)
                            CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                            in_stack_fffffffffffff95c.i);
            bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_3bc);
            if (bVar4) {
              eVar8 = QTime::minute((QTime *)CONCAT44(in_stack_fffffffffffff95c.i,
                                                      in_stack_fffffffffffff958));
              bVar4 = false;
              if (eVar8 != local_34) goto LAB_007712b4;
            }
            local_3c0.super_QFlagsStorage<QDateTimeParser::Section>.i =
                 (QFlagsStorage<QDateTimeParser::Section>)
                 QFlags<QDateTimeParser::Section>::operator&
                           ((QFlags<QDateTimeParser::Section> *)
                            CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                            in_stack_fffffffffffff95c.i);
            bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_3c0);
            if (bVar4) {
              eVar8 = QTime::second((QTime *)CONCAT44(in_stack_fffffffffffff95c.i,
                                                      in_stack_fffffffffffff958));
              bVar4 = false;
              if (eVar8 != local_38) goto LAB_007712b4;
            }
            local_3c4.super_QFlagsStorage<QDateTimeParser::Section>.i =
                 (QFlagsStorage<QDateTimeParser::Section>)
                 QFlags<QDateTimeParser::Section>::operator&
                           ((QFlags<QDateTimeParser::Section> *)
                            CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                            in_stack_fffffffffffff95c.i);
            bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_3c4);
            bVar4 = true;
            if (bVar2) {
              eVar8 = QTime::msec((QTime *)CONCAT44(in_stack_fffffffffffff95c.i,
                                                    in_stack_fffffffffffff958));
              bVar4 = eVar8 == local_3c;
            }
          }
LAB_007712b4:
          if (bVar4) {
            StateNode::StateNode
                      (in_stack_fffffffffffff970,
                       (QDateTime *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968.i),
                       in_stack_fffffffffffff964,in_stack_fffffffffffff960,
                       SUB41(in_stack_fffffffffffff95c.i >> 0x18,0));
          }
          QDateTime::~QDateTime((QDateTime *)0x77133f);
          if (!bVar4) goto LAB_0077155f;
        }
      }
      QDateTime::~QDateTime((QDateTime *)0x7715a9);
      goto LAB_007715ba;
    }
  }
  StateNode::StateNode((StateNode *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
LAB_007715ba:
  QTimeZone::~QTimeZone((QTimeZone *)0x7715c7);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDateTimeParser::StateNode
QDateTimeParser::scanString(const QDateTime &defaultValue, bool fixup) const
{
    State state = Acceptable;
    bool conflicts = false;
    const int sectionNodesCount = sectionNodes.size();
    int padding = 0;
    int pos = 0;
    int year, month, day;
    const QDate defaultDate = defaultValue.date();
    const QTime defaultTime = defaultValue.time();
    defaultDate.getDate(&year, &month, &day);
    int year2digits = year % 100;
    int hour = defaultTime.hour();
    int hour12 = -1;
    int minute = defaultTime.minute();
    int second = defaultTime.second();
    int msec = defaultTime.msec();
    int dayofweek = calendar.dayOfWeek(defaultDate);
    QTimeZone timeZone = defaultValue.timeRepresentation();

    int ampm = -1;
    Sections isSet = NoSection;

    for (int index = 0; index < sectionNodesCount; ++index) {
        Q_ASSERT(state != Invalid);
        const QString &separator = separators.at(index);
        int step = matchesSeparator(QStringView{m_text}.sliced(pos), separator);
        if (step == -1) {
            QDTPDEBUG << "invalid because" << QStringView{m_text}.sliced(pos)
                      << "does not start with" << separator
                      << index << pos << currentSectionIndex;
            return StateNode();
        }
        pos += step;
        sectionNodes[index].pos = pos;
        int *current = nullptr;
        int zoneOffset; // Needed to serve as *current when setting zone
        const SectionNode sn = sectionNodes.at(index);
        const QDateTime usedDateTime = [&] {
            const QDate date = actualDate(isSet, calendar, defaultCenturyStart,
                                          year, year2digits, month, day, dayofweek);
            const QTime time = actualTime(isSet, hour, hour12, ampm, minute, second, msec);
            return QDateTime(date, time, timeZone);
        }();
        ParsedSection sect = parseSection(usedDateTime, index, pos);

        QDTPDEBUG << "sectionValue" << sn.name() << m_text
                  << "pos" << pos << "used" << sect.used << stateName(sect.state);

        padding += sect.zeroes;
        if (fixup && sect.state == Intermediate && sect.used < sn.count) {
            const FieldInfo fi = fieldInfo(index);
            if ((fi & (Numeric|FixedWidth)) == (Numeric|FixedWidth)) {
                const QString newText = QString::asprintf("%0*d", sn.count, sect.value);
                m_text.replace(pos, sect.used, newText);
                sect.used = sn.count;
            }
        }

        state = qMin<State>(state, sect.state);
        // QDateTimeEdit can fix Intermediate and zeroes, but input needing that didn't match format:
        if (state == Invalid || (context == FromString && (state == Intermediate || sect.zeroes)))
            return StateNode();

        switch (sn.type) {
        case TimeZoneSection:
            current = &zoneOffset;
            if (sect.used > 0) {
                // Synchronize with what findTimeZone() found:
                QStringView zoneName = QStringView{m_text}.sliced(pos, sect.used);
                Q_ASSERT(!zoneName.isEmpty()); // sect.used > 0

                const QStringView offsetStr
                    = zoneName.startsWith("UTC"_L1) ? zoneName.sliced(3) : zoneName;
                const bool isUtcOffset = offsetStr.startsWith(u'+') || offsetStr.startsWith(u'-');
                const bool isUtc = zoneName == "Z"_L1 || zoneName == "UTC"_L1;

                if (isUtc || isUtcOffset) {
                    timeZone = QTimeZone::fromSecondsAheadOfUtc(sect.value);
#if QT_CONFIG(timezone)
                } else if (startsWithLocalTimeZone(zoneName, usedDateTime, locale()) != sect.used) {
                    QTimeZone namedZone = QTimeZone(zoneName.toLatin1());
                    Q_ASSERT(namedZone.isValid());
                    timeZone = namedZone;
#endif
                } else {
                    timeZone = QTimeZone::LocalTime;
                }
            }
            break;
        case Hour24Section: current = &hour; break;
        case Hour12Section: current = &hour12; break;
        case MinuteSection: current = &minute; break;
        case SecondSection: current = &second; break;
        case MSecSection: current = &msec; break;
        case YearSection: current = &year; break;
        case YearSection2Digits: current = &year2digits; break;
        case MonthSection: current = &month; break;
        case DayOfWeekSectionShort:
        case DayOfWeekSectionLong: current = &dayofweek; break;
        case DaySection: current = &day; sect.value = qMax<int>(1, sect.value); break;
        case AmPmSection: current = &ampm; break;
        default:
            qWarning("QDateTimeParser::parse Internal error (%ls)",
                     qUtf16Printable(sn.name()));
            return StateNode();
        }
        Q_ASSERT(current);
        Q_ASSERT(sect.state != Invalid);

        if (sect.used > 0)
            pos += sect.used;
        QDTPDEBUG << index << sn.name() << "is set to"
                  << pos << "state is" << stateName(state);

        if (isSet & sn.type && *current != sect.value) {
            QDTPDEBUG << "CONFLICT " << sn.name() << *current << sect.value;
            conflicts = true;
            if (index != currentSectionIndex)
                continue;
        }
        *current = sect.value;

        // Record the present section:
        isSet |= sn.type;
    }

    int step = matchesSeparator(QStringView{m_text}.sliced(pos), separators.last());
    if (step == -1 || step + pos < m_text.size()) {
        QDTPDEBUG << "invalid because" << QStringView{m_text}.sliced(pos)
                  << "does not match" << separators.last() << pos;
        return StateNode();
    }

    if (parserType != QMetaType::QTime) {
        if (year % 100 != year2digits && (isSet & YearSection2Digits)) {
            const QDate date = actualDate(isSet, calendar, defaultCenturyStart,
                                          year, year2digits, month, day, dayofweek);
            if (!date.isValid()) {
                state = Invalid;
            } else if (!(isSet & YearSection)) {
                year = date.year();
            } else {
                conflicts = true;
                const SectionNode &sn = sectionNode(currentSectionIndex);
                if (sn.type == YearSection2Digits)
                    year = date.year();
            }
        }

        const auto fieldType = sectionType(currentSectionIndex);
        const QDate date(year, month, day, calendar);
        if ((!date.isValid() || dayofweek != calendar.dayOfWeek(date))
                && state == Acceptable && isSet & DayOfWeekSectionMask) {
            if (isSet & DaySection)
                conflicts = true;
            // Change to day of week should adjust day of month;
            // when day of month isn't set, so should change to year or month.
            if (currentSectionIndex == -1 || fieldType & DayOfWeekSectionMask
                    || (!conflicts && (fieldType & (YearSectionMask | MonthSection)))) {
                day = weekDayWithinMonth(calendar, year, month, day, dayofweek);
                QDTPDEBUG << year << month << day << dayofweek
                          << calendar.dayOfWeek(QDate(year, month, day, calendar));
            }
        }

        bool needfixday = false;
        if (fieldType & DaySectionMask) {
            cachedDay = day;
        } else if (cachedDay > day && !(isSet & DayOfWeekSectionMask && state == Acceptable)) {
            day = cachedDay;
            needfixday = true;
        }

        if (!calendar.isDateValid(year, month, day)) {
            if (day <= calendar.maximumDaysInMonth())
                cachedDay = day;
            if (day > calendar.minimumDaysInMonth() && calendar.isDateValid(year, month, 1))
                needfixday = true;
        }
        if (needfixday) {
            if (context == FromString)
                return StateNode();
            if (state == Acceptable && fixday) {
                day = qMin<int>(day, calendar.daysInMonth(month, year));

                const QLocale loc = locale();
                for (int i=0; i<sectionNodesCount; ++i) {
                    const SectionNode sn = sectionNode(i);
                    if (sn.type & DaySection) {
                        m_text.replace(sectionPos(sn), sectionSize(i), loc.toString(day));
                    } else if (sn.type & DayOfWeekSectionMask) {
                        const int dayOfWeek = calendar.dayOfWeek(QDate(year, month, day, calendar));
                        const QLocale::FormatType dayFormat =
                            (sn.type == DayOfWeekSectionShort
                             ? QLocale::ShortFormat : QLocale::LongFormat);
                        const QString dayName(loc.dayName(dayOfWeek, dayFormat));
                        m_text.replace(sectionPos(sn), sectionSize(i), dayName);
                    }
                }
            } else if (state > Intermediate) {
                state = Intermediate;
            }
        }
    }

    if (parserType != QMetaType::QDate) {
        if (isSet & Hour12Section) {
            const bool hasHour = isSet.testAnyFlag(Hour24Section);
            if (ampm == -1) // If we don't know from hour, assume am:
                ampm = !hasHour || hour < 12 ? 0 : 1;
            hour12 = hour12 % 12 + ampm * 12;
            if (!hasHour)
                hour = hour12;
            else if (hour != hour12)
                conflicts = true;
        } else if (ampm != -1) {
            if (!(isSet & (Hour24Section)))
                hour = 12 * ampm; // Special case: only ap section
            else if ((ampm == 0) != (hour < 12))
                conflicts = true;
        }
    }

    QDTPDEBUG << year << month << day << hour << minute << second << msec;
    Q_ASSERT(state != Invalid);

    const QDate date(year, month, day, calendar);
    const QTime time(hour, minute, second, msec);
    const QDateTime when = QDateTime(date, time, timeZone);

    if (when.time() != time || when.date() != date) {
        // In a spring-forward, if we hit the skipped hour, we may have been
        // shunted out of it.

        // If hour wasn't specified, so we're using our default, changing it may
        // fix that.
        if (!(isSet & HourSectionMask)) {
            switch (parserType) {
            case QMetaType::QDateTime: {
                qint64 msecs = when.toMSecsSinceEpoch();
                // Fortunately, that gets a useful answer, even though when is invalid ...
                const QDateTime replace = QDateTime::fromMSecsSinceEpoch(msecs, timeZone);
                const QTime tick = replace.time();
                if (replace.date() == date
                    && (!(isSet & MinuteSection) || tick.minute() == minute)
                    && (!(isSet & SecondSection) || tick.second() == second)
                    && (!(isSet & MSecSection)   || tick.msec() == msec)) {
                    return StateNode(replace, state, padding, conflicts);
                }
            } break;
            case QMetaType::QDate:
                // Don't care about time, so just use start of day (and ignore spec):
                return StateNode(date.startOfDay(QTimeZone::UTC),
                                 state, padding, conflicts);
                break;
            case QMetaType::QTime:
                // Don't care about date or representation, so pick a safe representation:
                return StateNode(QDateTime(date, time, QTimeZone::UTC),
                                 state, padding, conflicts);
            default:
                Q_UNREACHABLE_RETURN(StateNode());
            }
        } else if (state > Intermediate) {
            state = Intermediate;
        }
    }

    return StateNode(when, state, padding, conflicts);
}